

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O0

UBool __thiscall
icu_63::LocaleKeyFactory::handlesKey(LocaleKeyFactory *this,ICUServiceKey *key,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  undefined1 local_70 [8];
  UnicodeString id;
  Hashtable *supported;
  UErrorCode *status_local;
  ICUServiceKey *key_local;
  LocaleKeyFactory *this_local;
  
  iVar1 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[8])(this,status);
  id.fUnion._48_8_ = CONCAT44(extraout_var,iVar1);
  if (id.fUnion._48_8_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    UnicodeString::UnicodeString((UnicodeString *)local_70);
    (*(key->super_UObject)._vptr_UObject[5])(key,(UnicodeString *)local_70);
    pvVar2 = Hashtable::get((Hashtable *)id.fUnion._48_8_,(UnicodeString *)local_70);
    this_local._7_1_ = pvVar2 != (void *)0x0;
    UnicodeString::~UnicodeString((UnicodeString *)local_70);
  }
  return this_local._7_1_;
}

Assistant:

UBool
LocaleKeyFactory::handlesKey(const ICUServiceKey& key, UErrorCode& status) const {
    const Hashtable* supported = getSupportedIDs(status);
    if (supported) {
        UnicodeString id;
        key.currentID(id);
        return supported->get(id) != NULL;
    }
    return FALSE;
}